

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_tec_zone(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell,FILE *file)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_EDGE pRVar3;
  REF_INT RVar4;
  REF_INT node;
  REF_INT edge;
  REF_INT cell_edge;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  FILE *file_local;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar2 = ref_subdiv->grid->node;
  pRVar3 = ref_subdiv->edge;
  fprintf((FILE *)file,"zone t=\"celledge\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
          (ulong)(uint)(ref_cell->edge_per << 1),(ulong)(uint)ref_cell->edge_per,"point","felineseg"
         );
  for (node = 0; node < ref_cell->edge_per; node = node + 1) {
    RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,node,cell);
    iVar1 = pRVar3->e2n[RVar4 << 1];
    fprintf((FILE *)file," %.16e %.16e %.16e %d\n",pRVar2->real[iVar1 * 0xf],
            pRVar2->real[iVar1 * 0xf + 1],pRVar2->real[iVar1 * 0xf + 2],
            (ulong)(uint)ref_subdiv->mark[RVar4]);
    iVar1 = pRVar3->e2n[RVar4 * 2 + 1];
    fprintf((FILE *)file," %.16e %.16e %.16e %d\n",pRVar2->real[iVar1 * 0xf],
            pRVar2->real[iVar1 * 0xf + 1],pRVar2->real[iVar1 * 0xf + 2],
            (ulong)(uint)ref_subdiv->mark[RVar4]);
  }
  for (node = 0; node < ref_cell->edge_per; node = node + 1) {
    fprintf((FILE *)file," %d %d\n",(ulong)(node * 2 + 1),(ulong)(node * 2 + 2));
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_tec_zone(REF_SUBDIV ref_subdiv,
                                              REF_CELL ref_cell, REF_INT cell,
                                              FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_INT cell_edge, edge, node;

  fprintf(file,
          "zone t=\"celledge\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          2 * ref_cell_edge_per(ref_cell), ref_cell_edge_per(ref_cell), "point",
          "felineseg");

  for (cell_edge = 0; cell_edge < ref_cell_edge_per(ref_cell); cell_edge++) {
    edge = ref_subdiv_c2e(ref_subdiv, ref_cell, cell_edge, cell);
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ref_subdiv_mark(ref_subdiv, edge));
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ref_subdiv_mark(ref_subdiv, edge));
  }

  for (cell_edge = 0; cell_edge < ref_cell_edge_per(ref_cell); cell_edge++)
    fprintf(file, " %d %d\n", 1 + 2 * cell_edge, 2 + 2 * cell_edge);

  return REF_SUCCESS;
}